

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O3

void __thiscall SuiteMessageTests::TestgetFieldIfPresent::RunImpl(TestgetFieldIfPresent *this)

{
  TestResults *pTVar1;
  bool bVar2;
  int iVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  MsgType stored;
  MsgType initial;
  Message message;
  TestDetails local_258;
  undefined1 local_238 [16];
  _Alloc_hider local_228;
  size_t local_220;
  char local_218 [16];
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  size_t local_1e8;
  int local_1e0;
  undefined1 local_1d8 [16];
  _Alloc_hider local_1c8;
  size_t local_1c0;
  char local_1b8 [16];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  size_t local_188;
  int local_180;
  Message local_178 [344];
  
  FIX::Message::Message(local_178);
  local_238._0_8_ = &local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"A","");
  local_1d8._0_8_ = &PTR__FieldBase_00323d68;
  local_1d8._8_4_ = 0x23;
  local_1c8._M_p = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_238._0_8_,
             (long)(pointer *)local_238._0_8_ + CONCAT44(local_238._12_4_,local_238._8_4_));
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_188 = 0;
  local_180 = 0;
  local_1d8._0_8_ = &PTR__FieldBase_00324788;
  if ((_Alloc_hider *)local_238._0_8_ != &local_228) {
    operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_p + 1));
  }
  bVar2 = FIX::FieldMap::getFieldIfSet((FieldMap *)local_178,(FieldBase *)local_1d8);
  if (bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)local_238,*ppTVar5,0x78);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,(TestDetails *)local_238,"!message.getFieldIfSet( initial )");
  }
  local_258.suiteName = (char *)&local_258.filename;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"A","");
  local_238._0_8_ = &PTR__FieldBase_00323d68;
  local_238._8_4_ = 0x23;
  local_228._M_p = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_258.suiteName,local_258.testName + (long)local_258.suiteName
            );
  local_208._M_p = (pointer)&local_1f8;
  bVar2 = false;
  local_200 = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8 = 0;
  local_1e0 = 0;
  local_238._0_8_ = &PTR__FieldBase_00324788;
  if (local_1c0 == local_220) {
    if (local_1c0 == 0) {
      bVar2 = true;
    }
    else {
      iVar3 = bcmp(local_1c8._M_p,local_228._M_p,local_1c0);
      bVar2 = iVar3 == 0;
    }
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_238);
  if ((char **)local_258.suiteName != &local_258.filename) {
    operator_delete(local_258.suiteName,(ulong)(local_258.filename + 1));
  }
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails((TestDetails *)local_238,*ppTVar5,0x79);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,(TestDetails *)local_238,"initial == FIX::MsgType(\"A\")");
  }
  FIX::FieldMap::setField((FieldMap *)local_178,(FieldBase *)local_1d8,true);
  FIX::StringField::StringField((StringField *)local_238,0x23);
  local_238._0_8_ = &PTR__FieldBase_00324788;
  bVar2 = FIX::FieldMap::getFieldIfSet((FieldMap *)local_178,(FieldBase *)local_238);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_258,*ppTVar5,0x7d);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_258,"message.getFieldIfSet( stored )");
  }
  if (local_220 == local_1c0) {
    if (local_220 == 0) goto LAB_00200cfb;
    iVar3 = bcmp(local_228._M_p,local_1c8._M_p,local_220);
    if (iVar3 == 0) goto LAB_00200cfb;
  }
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_258,*ppTVar5,0x7e);
  UnitTest::TestResults::OnTestFailure(pTVar1,&local_258,"stored == initial");
LAB_00200cfb:
  FIX::FieldBase::~FieldBase((FieldBase *)local_238);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1d8);
  FIX::Message::~Message(local_178);
  return;
}

Assistant:

TEST(getFieldIfPresent)
{
  FIX::Message message;
  FIX::MsgType initial("A");
  CHECK( !message.getFieldIfSet( initial ) );
  CHECK( initial == FIX::MsgType("A") );

  message.setField( initial );
  FIX::MsgType stored;
  CHECK( message.getFieldIfSet( stored ) );
  CHECK( stored == initial );
}